

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O2

void duckdb::DisabledOptimizersSetting::ResetGlobal(DatabaseInstance *db,DBConfig *config)

{
  DBConfig local_6b0;
  
  DBConfig::DBConfig(&local_6b0);
  ::std::
  _Rb_tree<duckdb::OptimizerType,_duckdb::OptimizerType,_std::_Identity<duckdb::OptimizerType>,_std::less<duckdb::OptimizerType>,_std::allocator<duckdb::OptimizerType>_>
  ::operator=(&(config->options).disabled_optimizers._M_t,
              &local_6b0.options.disabled_optimizers._M_t);
  DBConfig::~DBConfig(&local_6b0);
  return;
}

Assistant:

void DisabledOptimizersSetting::ResetGlobal(DatabaseInstance *db, DBConfig &config) {
	config.options.disabled_optimizers = DBConfig().options.disabled_optimizers;
}